

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gencode.c
# Opt level: O0

slist * gen_load_prism_llprefixlen(compiler_state_t *cstate)

{
  slist *psVar1;
  slist *psVar2;
  slist *s1_00;
  slist *sjcommon;
  slist *sjeq_avs_cookie;
  slist *s2;
  slist *s1;
  compiler_state_t *cstate_local;
  
  cstate->no_optimize = 1;
  if ((cstate->off_linkhdr).reg == -1) {
    cstate_local = (compiler_state_t *)0x0;
  }
  else {
    cstate_local = (compiler_state_t *)new_stmt(cstate,0x20);
    *(bpf_int32 *)(cstate_local->top_ctx[0].__jmpbuf + 3) = 0;
    psVar1 = new_stmt(cstate,0x54);
    (psVar1->s).k = -0x1000;
    sappend((slist *)cstate_local,psVar1);
    psVar1 = new_stmt(cstate,0x15);
    (psVar1->s).k = -0x7fdef000;
    sappend((slist *)cstate_local,psVar1);
    psVar2 = new_stmt(cstate,0x20);
    (psVar2->s).k = 4;
    sappend((slist *)cstate_local,psVar2);
    (psVar1->s).jt = psVar2;
    psVar2 = new_stmt(cstate,5);
    (psVar2->s).k = 1;
    sappend((slist *)cstate_local,psVar2);
    s1_00 = new_stmt(cstate,0);
    (s1_00->s).k = 0x90;
    sappend((slist *)cstate_local,s1_00);
    (psVar1->s).jf = s1_00;
    psVar1 = new_stmt(cstate,2);
    (psVar1->s).k = (cstate->off_linkhdr).reg;
    sappend((slist *)cstate_local,psVar1);
    (psVar2->s).jf = psVar1;
    psVar1 = new_stmt(cstate,7);
    sappend((slist *)cstate_local,psVar1);
  }
  return (slist *)cstate_local;
}

Assistant:

static struct slist *
gen_load_prism_llprefixlen(compiler_state_t *cstate)
{
	struct slist *s1, *s2;
	struct slist *sjeq_avs_cookie;
	struct slist *sjcommon;

	/*
	 * This code is not compatible with the optimizer, as
	 * we are generating jmp instructions within a normal
	 * slist of instructions
	 */
	cstate->no_optimize = 1;

	/*
	 * Generate code to load the length of the radio header into
	 * the register assigned to hold that length, if one has been
	 * assigned.  (If one hasn't been assigned, no code we've
	 * generated uses that prefix, so we don't need to generate any
	 * code to load it.)
	 *
	 * Some Linux drivers use ARPHRD_IEEE80211_PRISM but sometimes
	 * or always use the AVS header rather than the Prism header.
	 * We load a 4-byte big-endian value at the beginning of the
	 * raw packet data, and see whether, when masked with 0xFFFFF000,
	 * it's equal to 0x80211000.  If so, that indicates that it's
	 * an AVS header (the masked-out bits are the version number).
	 * Otherwise, it's a Prism header.
	 *
	 * XXX - the Prism header is also, in theory, variable-length,
	 * but no known software generates headers that aren't 144
	 * bytes long.
	 */
	if (cstate->off_linkhdr.reg != -1) {
		/*
		 * Load the cookie.
		 */
		s1 = new_stmt(cstate, BPF_LD|BPF_W|BPF_ABS);
		s1->s.k = 0;

		/*
		 * AND it with 0xFFFFF000.
		 */
		s2 = new_stmt(cstate, BPF_ALU|BPF_AND|BPF_K);
		s2->s.k = 0xFFFFF000;
		sappend(s1, s2);

		/*
		 * Compare with 0x80211000.
		 */
		sjeq_avs_cookie = new_stmt(cstate, JMP(BPF_JEQ));
		sjeq_avs_cookie->s.k = 0x80211000;
		sappend(s1, sjeq_avs_cookie);

		/*
		 * If it's AVS:
		 *
		 * The 4 bytes at an offset of 4 from the beginning of
		 * the AVS header are the length of the AVS header.
		 * That field is big-endian.
		 */
		s2 = new_stmt(cstate, BPF_LD|BPF_W|BPF_ABS);
		s2->s.k = 4;
		sappend(s1, s2);
		sjeq_avs_cookie->s.jt = s2;

		/*
		 * Now jump to the code to allocate a register
		 * into which to save the header length and
		 * store the length there.  (The "jump always"
		 * instruction needs to have the k field set;
		 * it's added to the PC, so, as we're jumping
		 * over a single instruction, it should be 1.)
		 */
		sjcommon = new_stmt(cstate, JMP(BPF_JA));
		sjcommon->s.k = 1;
		sappend(s1, sjcommon);

		/*
		 * Now for the code that handles the Prism header.
		 * Just load the length of the Prism header (144)
		 * into the A register.  Have the test for an AVS
		 * header branch here if we don't have an AVS header.
		 */
		s2 = new_stmt(cstate, BPF_LD|BPF_W|BPF_IMM);
		s2->s.k = 144;
		sappend(s1, s2);
		sjeq_avs_cookie->s.jf = s2;

		/*
		 * Now allocate a register to hold that value and store
		 * it.  The code for the AVS header will jump here after
		 * loading the length of the AVS header.
		 */
		s2 = new_stmt(cstate, BPF_ST);
		s2->s.k = cstate->off_linkhdr.reg;
		sappend(s1, s2);
		sjcommon->s.jf = s2;

		/*
		 * Now move it into the X register.
		 */
		s2 = new_stmt(cstate, BPF_MISC|BPF_TAX);
		sappend(s1, s2);

		return (s1);
	} else
		return (NULL);
}